

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O2

void zprint_lu_col(char *msg,int jcol,int pivrow,int_t *xprune,GlobalLU_t *Glu)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int_t *piVar4;
  int_t *piVar5;
  void *pvVar6;
  int_t *piVar7;
  void *pvVar8;
  int_t *piVar9;
  int_t *piVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  
  piVar2 = Glu->xsup;
  piVar3 = Glu->supno;
  piVar4 = Glu->lsub;
  piVar5 = Glu->xlsub;
  pvVar6 = Glu->lusup;
  piVar7 = Glu->xlusup;
  pvVar8 = Glu->ucol;
  piVar9 = Glu->usub;
  piVar10 = Glu->xusub;
  printf("%s",msg);
  printf("col %d: pivrow %d, supno %d, xprune %lld\n",jcol,pivrow,(ulong)(uint)piVar3[jcol],
         (long)xprune[jcol]);
  puts("\tU-col:");
  lVar12 = (long)piVar10[jcol];
  puVar11 = (undefined8 *)((long)pvVar8 + lVar12 * 0x10 + 8);
  for (; lVar12 < piVar10[jcol + 1]; lVar12 = lVar12 + 1) {
    printf("\t%d%10.4f, %10.4f\n",puVar11[-1],*puVar11,(ulong)(uint)piVar9[lVar12]);
    puVar11 = puVar11 + 2;
  }
  puts("\tL-col in rectangular snode:");
  iVar1 = piVar2[piVar3[jcol]];
  lVar13 = (long)piVar5[iVar1];
  lVar12 = (long)piVar7[jcol];
  puVar11 = (undefined8 *)((long)pvVar6 + lVar12 * 0x10 + 8);
  for (; (lVar13 < piVar5[(long)iVar1 + 1] && (lVar12 < piVar7[jcol + 1])); lVar12 = lVar12 + 1) {
    printf("\t%d\t%10.4f, %10.4f\n",puVar11[-1],*puVar11,(ulong)(uint)piVar4[lVar13]);
    lVar13 = lVar13 + 1;
    puVar11 = puVar11 + 2;
  }
  fflush(_stdout);
  return;
}

Assistant:

void
zprint_lu_col(char *msg, int jcol, int pivrow, int_t *xprune, GlobalLU_t *Glu)
{
    int_t    i, k;
    int     *xsup, *supno, fsupc;
    int_t   *xlsub, *lsub;
    doublecomplex  *lusup;
    int_t   *xlusup;
    doublecomplex  *ucol;
    int_t   *usub, *xusub;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    ucol    = (doublecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    
    printf("%s", msg);
    printf("col %d: pivrow %d, supno %d, xprune %lld\n", 
	   jcol, pivrow, supno[jcol], (long long) xprune[jcol]);
    
    printf("\tU-col:\n");
    for (i = xusub[jcol]; i < xusub[jcol+1]; i++)
	printf("\t%d%10.4f, %10.4f\n", (int)usub[i], ucol[i].r, ucol[i].i);
    printf("\tL-col in rectangular snode:\n");
    fsupc = xsup[supno[jcol]];	/* first col of the snode */
    i = xlsub[fsupc];
    k = xlusup[jcol];
    while ( i < xlsub[fsupc+1] && k < xlusup[jcol+1] ) {
	printf("\t%d\t%10.4f, %10.4f\n", (int)lsub[i], lusup[k].r, lusup[k].i);
	i++; k++;
    }
    fflush(stdout);
}